

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pla.h
# Opt level: O3

Pla_Man_t * Pla_ManAlloc(char *pFileName,int nIns,int nOuts,int nCubes)

{
  undefined1 auVar1 [16];
  Pla_Man_t *pPVar2;
  char *pcVar3;
  size_t sVar4;
  int *piVar5;
  word *pwVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  pPVar2 = (Pla_Man_t *)calloc(1,0x98);
  pcVar3 = Extra_FileDesignName(pFileName);
  pPVar2->pName = pcVar3;
  iVar10 = 0;
  if (pFileName == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pFileName);
    pcVar3 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar3,pFileName);
  }
  pPVar2->pSpec = pcVar3;
  pPVar2->nIns = nIns;
  pPVar2->nOuts = nOuts;
  iVar8 = ((nIns >> 5) + 1) - (uint)((nIns & 0x1fU) == 0);
  pPVar2->nInWords = iVar8;
  iVar12 = ((nOuts >> 5) + 1) - (uint)((nOuts & 0x1fU) == 0);
  pPVar2->nOutWords = iVar12;
  if (0 < nCubes) {
    piVar5 = (int *)malloc((ulong)(uint)nCubes * 4);
    (pPVar2->vCubes).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pPVar2->vCubes).nCap = nCubes;
    auVar1 = _DAT_007ee2e0;
    lVar11 = (ulong)(uint)nCubes - 1;
    auVar13._8_4_ = (int)lVar11;
    auVar13._0_8_ = lVar11;
    auVar13._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar7 = 0;
    auVar13 = auVar13 ^ _DAT_007ee2e0;
    auVar14 = _DAT_007ee2d0;
    do {
      auVar15 = auVar14 ^ auVar1;
      if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                  auVar13._4_4_ < auVar15._4_4_) & 1)) {
        piVar5[uVar7] = (int)uVar7;
      }
      if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
          auVar15._12_4_ <= auVar13._12_4_) {
        piVar5[uVar7 + 1] = (int)uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar11 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar11 + 2;
    } while ((nCubes + 1U & 0xfffffffe) != uVar7);
    iVar10 = (pPVar2->vInBits).nCap;
  }
  (pPVar2->vCubes).nSize = nCubes;
  uVar9 = iVar8 * nCubes;
  if (iVar10 < (int)uVar9) {
    pwVar6 = (word *)malloc((long)(int)uVar9 << 3);
    (pPVar2->vInBits).pArray = pwVar6;
    if (pwVar6 == (word *)0x0) goto LAB_0035c93f;
    (pPVar2->vInBits).nCap = uVar9;
  }
  else {
    pwVar6 = (word *)0x0;
  }
  if (0 < (int)uVar9) {
    memset(pwVar6,0,(ulong)uVar9 << 3);
  }
  (pPVar2->vInBits).nSize = uVar9;
  uVar9 = iVar12 * nCubes;
  if ((pPVar2->vOutBits).nCap < (int)uVar9) {
    pwVar6 = (word *)malloc((long)(int)uVar9 << 3);
    (pPVar2->vOutBits).pArray = pwVar6;
    if (pwVar6 == (word *)0x0) {
LAB_0035c93f:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                    ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    (pPVar2->vOutBits).nCap = uVar9;
  }
  else {
    pwVar6 = (word *)0x0;
  }
  if (0 < (int)uVar9) {
    memset(pwVar6,0,(ulong)uVar9 << 3);
  }
  (pPVar2->vOutBits).nSize = uVar9;
  return pPVar2;
}

Assistant:

static inline Pla_Man_t * Pla_ManAlloc( char * pFileName, int nIns, int nOuts, int nCubes )
{
    Pla_Man_t * p = ABC_CALLOC( Pla_Man_t, 1 );
    p->pName = Extra_FileDesignName( pFileName );
    p->pSpec = Abc_UtilStrsav( pFileName );
    p->nIns  = nIns;
    p->nOuts = nOuts;
    p->nInWords  = Abc_Bit6WordNum( 2*nIns );
    p->nOutWords = Abc_Bit6WordNum( 2*nOuts );
    Vec_IntFillNatural( &p->vCubes, nCubes );
    Vec_WrdFill( &p->vInBits,  Pla_ManCubeNum(p) * p->nInWords,  0 );
    Vec_WrdFill( &p->vOutBits, Pla_ManCubeNum(p) * p->nOutWords, 0 );
    return p;
}